

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2dff67::ReaderThread::run(ReaderThread *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  Imf_3_2::RgbaInputFile::header();
  lVar3 = Imf_3_2::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 0xc);
  Imf_3_2::RgbaInputFile::header();
  lVar3 = Imf_3_2::Header::dataWindow();
  iVar2 = *(int *)(lVar3 + 4);
  for (iVar4 = this->_start; iVar4 <= iVar1 - iVar2; iVar4 = iVar4 + this->_step) {
    Imf_3_2::RgbaInputFile::readPixels((int)this->_infile);
  }
  IlmThread_3_2::Semaphore::post();
  return;
}

Assistant:

void
ReaderThread::run ()
{

    int num = _infile->header ().dataWindow ().max.y -
              _infile->header ().dataWindow ().min.y + 1;

    for (int i = _start; i < num; i += _step)
        _infile->readPixels (i);

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}